

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O0

JL_STATUS SkipWhiteSpace(ParseParameters *Params,char *pNextChar)

{
  char cVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  char nextNextChar;
  char nextChar;
  char currentChar;
  _Bool inMultiLineComment;
  _Bool inSingleLineComment;
  JL_STATUS jlStatus;
  char *pNextChar_local;
  ParseParameters *Params_local;
  
  bVar4 = false;
  bVar5 = false;
  do {
    if (Params->JsonStringLength <= Params->StringIndex) {
      return JL_STATUS_END_OF_DATA;
    }
    cVar1 = Params->JsonString[Params->StringIndex];
    cVar2 = Params->JsonString[Params->StringIndex + 1];
    if (cVar2 == '\0') {
      cVar3 = '\0';
    }
    else {
      cVar3 = Params->JsonString[Params->StringIndex + 2];
    }
    if ((bVar4) && (cVar1 == '\n')) {
      bVar4 = false;
    }
    else if ((bVar5) && ((cVar1 == '*' && (cVar2 == '/')))) {
      bVar5 = false;
      Params->StringIndex = Params->StringIndex + 1;
    }
    else if ((!bVar4) &&
            (((((!bVar5 && (cVar1 != ' ')) && (cVar1 != '\n')) &&
              (((cVar1 != '\r' && (cVar1 != '\t')) &&
               ((cVar1 != '\v' || ((Params->IsJson5 & 1U) == 0)))))) &&
             ((cVar1 != '\f' || ((Params->IsJson5 & 1U) == 0)))))) {
      if (((Params->IsJson5 & 1U) == 0) || ((cVar1 != -0x3e || (cVar2 != -0x60)))) {
        if (((Params->IsJson5 & 1U) == 0) ||
           ((((cVar1 != -0x1e || (cVar2 != -0x80)) || (cVar3 != -0x58)) &&
            ((((cVar1 != -0x1e || (cVar2 != -0x80)) || (cVar3 != -0x57)) &&
             (((cVar1 != -0x11 || (cVar2 != -0x45)) || (cVar3 != -0x41)))))))) {
          if ((((Params->IsJson5 & 1U) == 0) || (cVar1 != '/')) || (cVar2 != '/')) {
            if ((((Params->IsJson5 & 1U) == 0) || (cVar1 != '/')) || (cVar2 != '*')) {
              *pNextChar = cVar1;
              return JL_STATUS_SUCCESS;
            }
            bVar5 = true;
            Params->StringIndex = Params->StringIndex + 1;
          }
          else {
            bVar4 = true;
            Params->StringIndex = Params->StringIndex + 1;
          }
        }
        else {
          Params->StringIndex = Params->StringIndex + 2;
        }
      }
      else {
        Params->StringIndex = Params->StringIndex + 1;
      }
    }
    Params->StringIndex = Params->StringIndex + 1;
  } while( true );
}

Assistant:

static
JL_STATUS
    SkipWhiteSpace
    (
        ParseParameters*    Params,
        char*               pNextChar
    )
{
    JL_STATUS jlStatus;
    bool inSingleLineComment = false;
    bool inMultiLineComment = false;

    jlStatus = JL_STATUS_END_OF_DATA;
    while( Params->StringIndex < Params->JsonStringLength )
    {
        char currentChar = Params->JsonString[Params->StringIndex];
        char nextChar = Params->JsonString[Params->StringIndex+1];
        char nextNextChar = 0 != nextChar ? Params->JsonString[Params->StringIndex+2] : 0;

        // See if currently in a comment and if this is the end of comment.
        if( inSingleLineComment && '\n' == currentChar )
        {
            inSingleLineComment = false;
        }
        else if( inMultiLineComment && '*' == currentChar && '/' == nextChar )
        {
            inMultiLineComment = false;
            Params->StringIndex  += 1;      // Skip the extra char (the '/')
        }
        else if( inSingleLineComment || inMultiLineComment )
        {
            // In comment, so ignore
        }
        else if(     ' '  == currentChar
            ||  '\n' == currentChar
            ||  '\r' == currentChar
            ||  '\t' == currentChar
            ||  ( '\v' == currentChar && Params->IsJson5 )
            ||  ( '\f' == currentChar && Params->IsJson5 ) )
        {
            // White space, so ignore
        }
        else if( Params->IsJson5 && '\xc2' == currentChar && '\xa0' == nextChar )
        {
            // Non-breaking space allowed by json5
            Params->StringIndex += 1;
        }
        else if(    Params->IsJson5
                 && (   ( '\xe2' == currentChar && '\x80' == nextChar && '\xa8' == nextNextChar )        // Line separator
                     || ( '\xe2' == currentChar && '\x80' == nextChar && '\xa9' == nextNextChar )        // Paragraph separator
                     || ( '\xef' == currentChar && '\xbb' == nextChar && '\xbf' == nextNextChar ) ) )    // Byte order mark
        {
            // Extra white space allowed by json5
            Params->StringIndex += 2;
        }
        else if( Params->IsJson5 && '/' == currentChar && '/' == nextChar )
        {
            inSingleLineComment = true;
            Params->StringIndex += 1;
        }
        else if( Params->IsJson5 && '/' == currentChar && '*' == nextChar )
        {
            inMultiLineComment = true;
            Params->StringIndex += 1;
        }
        else
        {
            // First non whitespace/comment
            *pNextChar = currentChar;
            jlStatus = JL_STATUS_SUCCESS;
            break;
        }

        Params->StringIndex += 1;
    }

    return jlStatus;
}